

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa.cpp
# Opt level: O3

unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> __thiscall
mg::data::MappedHfa::parse(MappedHfa *this,shared_ptr<mg::fs::MappedFile> *backing_data)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  pointer pPVar3;
  MappedHfa *this_01;
  int iVar4;
  long *plVar5;
  undefined1 local_110 [8];
  PackedEntryHeader entry;
  long local_80;
  FileHeader header;
  undefined1 auStack_48 [8];
  vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
  entries;
  
  peVar1 = (backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if ((ulong)peVar1->_size < 0x10) {
    parse(this);
  }
  else {
    plVar5 = (long *)peVar1->_data;
    lVar2 = plVar5[1];
    header.magic._0_4_ = SUB84(lVar2,0);
    header.magic._0_8_ = lVar2;
    if (header.magic._0_4_ == 0x30314146 && *plVar5 == 0x45474758454e5548) {
      auStack_48 = (undefined1  [8])0x0;
      entries.
      super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entries.
      super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      header.magic._4_4_ = SUB84((ulong)lVar2 >> 0x20,0);
      if (header.magic._4_4_ != 0) {
        plVar5 = plVar5 + 2;
        iVar4 = header.magic._4_4_;
        do {
          memcpy((PackedEntryHeader *)local_110,plVar5,0x80);
          pPVar3 = entries.
                   super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (entries.
              super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              entries.
              super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<mg::data::Hfa::PackedEntryHeader,std::allocator<mg::data::Hfa::PackedEntryHeader>>
            ::_M_realloc_insert<mg::data::Hfa::PackedEntryHeader&>
                      ((vector<mg::data::Hfa::PackedEntryHeader,std::allocator<mg::data::Hfa::PackedEntryHeader>>
                        *)auStack_48,
                       (iterator)
                       entries.
                       super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                       ._M_impl.super__Vector_impl_data._M_start,(PackedEntryHeader *)local_110);
          }
          else {
            memmove(entries.
                    super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                    ._M_impl.super__Vector_impl_data._M_start,plVar5,0x80);
            entries.
            super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
            ._M_impl.super__Vector_impl_data._M_start = pPVar3 + 1;
          }
          plVar5 = plVar5 + 0x10;
          iVar4 = iVar4 + -1;
          lVar2 = header.magic._0_8_;
        } while (iVar4 != 0);
      }
      header.magic._0_8_ = lVar2;
      this_01 = (MappedHfa *)operator_new(0x28);
      header._8_8_ = (backing_data->
                     super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (backing_data->super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::
      vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>::
      vector((vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              *)(entry._padding + 0x10),
             (vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              *)auStack_48);
      MappedHfa(this_01,(shared_ptr<mg::fs::MappedFile> *)(header.magic + 8),
                (vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                 *)(entry._padding + 0x10));
      (this->_backing_data).super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this_01;
      if (entry._padding._16_8_ != 0) {
        operator_delete((void *)entry._padding._16_8_,local_80 - entry._padding._16_8_);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,
                        (long)entries.
                              super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
      }
    }
    else {
      parse(this);
    }
  }
  return (__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
         )(__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<MappedHfa>
MappedHfa::parse(std::shared_ptr<mg::fs::MappedFile> backing_data) {
  // Check file larger enough to have a header
  if ((size_t)backing_data->size() < sizeof(Hfa::FileHeader)) {
    fprintf(stderr, "File too short to read header\n");
    return nullptr;
  }

  // Check magic is correct
  Hfa::FileHeader header = *(Hfa::FileHeader *)backing_data->data();
  if (!!memcmp(header.magic, Hfa::MAGIC, strlen(Hfa::MAGIC))) {
    fprintf(stderr, "File has invalid magic\n");
    return nullptr;
  }

  // Parse each of the header entries
  std::vector<Hfa::PackedEntryHeader> entries;
  const uint32_t entry_count = le_to_host_u32(header.entry_count);
  const Hfa::PackedEntryHeader *entry_ptr =
      reinterpret_cast<const Hfa::PackedEntryHeader *>(backing_data->data() +
                                                       sizeof(Hfa::FileHeader));
  for (uint32_t i = 0; i < entry_count; i++, entry_ptr++) {
    // Copy the entry, convert it to host order and add it to our entry list
    Hfa::PackedEntryHeader entry = *entry_ptr;
    entry.to_host_order();
    entries.emplace_back(entry);
  }

  return std::unique_ptr<MappedHfa>(new MappedHfa(backing_data, entries));
}